

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

uchar b64reverse(char letter)

{
  undefined1 local_9;
  char letter_local;
  
  if ((letter < 'A') || ('Z' < letter)) {
    if ((letter < 'a') || ('z' < letter)) {
      if ((letter < '0') || ('9' < letter)) {
        if (letter == '+') {
          local_9 = '>';
        }
        else if (letter == '/') {
          local_9 = '?';
        }
        else if (letter == '=') {
          local_9 = 0xff;
        }
        else {
          local_9 = 0xfe;
        }
      }
      else {
        local_9 = letter + '\x04';
      }
    }
    else {
      local_9 = letter + 0xb9;
    }
  }
  else {
    local_9 = letter + 0xbf;
  }
  return local_9;
}

Assistant:

static unsigned char
b64reverse(char letter)
{
	if ((letter >= 'A') && (letter <= 'Z')) {
		return (unsigned char)(letter - 'A');
	}
	if ((letter >= 'a') && (letter <= 'z')) {
		return (unsigned char)(letter - 'a' + 26);
	}
	if ((letter >= '0') && (letter <= '9')) {
		return (unsigned char)(letter - '0' + 52);
	}
	if (letter == '+') {
		return 62;
	}
	if (letter == '/') {
		return 63;
	}
	if (letter == '=') {
		return 255; /* normal end */
	}
	return 254; /* error */
}